

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortestPathTN93.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__filename;
  char resolutionOption;
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  FILE *pFVar5;
  ostream *poVar6;
  char *pcVar7;
  unsigned_long theSequence;
  long lVar8;
  long which_arg;
  undefined4 in_register_0000003c;
  ulong uVar9;
  ulong uVar10;
  bool is_json;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  char automatonState;
  double local_80;
  FILE *local_78;
  long firstSequenceLength;
  char **local_68;
  double dStack_60;
  double local_58;
  ulong local_50;
  double local_48;
  double dStack_40;
  
  local_50 = CONCAT44(in_register_0000003c,argc);
  if (argc < 9) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Usage is `");
    poVar6 = std::operator<<(poVar6,Usage);
    poVar6 = std::operator<<(poVar6,"\'.");
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(1);
  }
  pcVar7 = argv[1];
  firstSequenceLength = 0;
  iVar1 = atoi(argv[4]);
  if (iVar1 < 1) {
    poVar6 = (ostream *)&std::cerr;
    pcVar7 = "Minimum overlap must be a positive integer";
  }
  else {
    if ((*pcVar7 != '-') || (pFVar4 = _stdin, pcVar7[1] != '\0')) {
      pFVar4 = fopen(pcVar7,"r");
    }
    __filename = argv[2];
    if ((*__filename != '-') || (pFVar5 = _stdout, __filename[1] != '\0')) {
      pFVar5 = fopen(__filename,"w");
    }
    if (pFVar4 == (FILE *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Cannot open file `");
      poVar6 = std::operator<<(poVar6,pcVar7);
    }
    else {
      if (pFVar5 != (FILE *)0x0) {
        pcVar7 = argv[3];
        iVar2 = strcmp(pcVar7,"GAPMM");
        local_78 = pFVar5;
        if (iVar2 == 0) {
          local_68 = (char **)CONCAT71(local_68._1_7_,3);
        }
        else {
          iVar2 = strcmp(pcVar7,"AVERAGE");
          if (iVar2 == 0) {
            local_68 = (char **)CONCAT71(local_68._1_7_,1);
          }
          else {
            iVar2 = strcmp(pcVar7,"SKIP");
            local_68 = (char **)CONCAT71(local_68._1_7_,(iVar2 == 0) * '\x02');
          }
        }
        automatonState = '\0';
        Vector::appendValue(&nameLengths,0);
        Vector::appendValue(&seqLengths,0);
        initAlphabets(false,(char *)0x0,false);
        iVar2 = readFASTA((FILE *)pFVar4,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                          &firstSequenceLength,false,(Vector *)0x0,':',1.0,false);
        if (iVar2 == 1) {
          return 1;
        }
        fclose(pFVar4);
        uVar9 = seqLengths.vLength - 1;
        poVar6 = std::operator<<((ostream *)&std::cerr,"Read ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," sequences of length ");
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar2 = atoi(argv[5]);
        uVar10 = (ulong)iVar2;
        if (uVar10 < uVar9) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Using ");
          pcVar7 = stringText(&names,&nameLengths,uVar10);
          poVar6 = std::operator<<(poVar6,pcVar7);
          poVar6 = std::operator<<(poVar6," as the source");
          std::endl<char,std::char_traits<char>>(poVar6);
          initializeSingleSource(uVar9,uVar10);
          local_58 = atof(argv[7]);
          if (0.0 < local_58) {
            auVar11._8_4_ = (int)(uVar9 >> 0x20);
            auVar11._0_8_ = uVar9;
            auVar11._12_4_ = 0x45300000;
            local_80 = 100.0 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
            std::operator<<((ostream *)&std::cerr,"Using step penalty of ");
            poVar6 = std::ostream::_M_insert<double>(local_58);
            std::endl<char,std::char_traits<char>>(poVar6);
            dVar14 = 0.0;
            dVar15 = 0.0;
            resolutionOption = (char)local_68;
            do {
              if (workingNodes.vLength == 0) {
                std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                local_68 = argv;
                iVar2 = strcmp(argv[6],"JSON");
                local_80 = (double)CONCAT44(local_80._4_4_,iVar2);
                if (iVar2 == 0) {
                  fwrite("\n{\n",3,1,local_78);
                }
                iVar2 = (int)local_50;
                uVar10 = local_50 & 0xffffffff;
                for (uVar9 = 8; pFVar4 = local_78, uVar9 < uVar10; uVar9 = uVar9 + 1) {
                  is_json = local_80._0_4_ == 0;
                  iVar3 = atoi(local_68[uVar9]);
                  reportPathToSource((long)iVar3,(FILE *)local_78,is_json,firstSequenceLength,
                                     resolutionOption,(long)iVar1,local_58);
                  if (is_json && uVar9 < iVar2 - 1) {
                    fwrite(",\n",2,1,local_78);
                  }
                }
                if (local_80._0_4_ == 0) {
                  fwrite("\n}\n",3,1,local_78);
                }
                if (pFVar4 == _stdout) {
                  return 0;
                }
                fclose(pFVar4);
                return 0;
              }
              local_68 = (char **)-dVar14;
              dStack_60 = -dVar15;
              local_48 = dVar14;
              dStack_40 = dVar15;
              do {
                theSequence = Vector::extractMin(&workingNodes,&distanceEstimates);
                relaxDistanceEstimates
                          (theSequence,firstSequenceLength,resolutionOption,(long)iVar1,local_58);
                lVar8 = uVar9 - workingNodes.vLength;
                auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
                auVar12._0_8_ = lVar8;
                auVar12._12_4_ = 0x45300000;
                if (0.1 < ((auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * local_80
                          + (double)local_68) break;
              } while (workingNodes.vLength != 0);
              poVar6 = std::operator<<((ostream *)&std::cerr,
                                       "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                                      );
              *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
              poVar6 = std::ostream::_M_insert<double>(local_48);
              std::operator<<(poVar6,"% done ");
              lVar8 = uVar9 - workingNodes.vLength;
              auVar13._8_4_ = (int)((ulong)lVar8 >> 0x20);
              auVar13._0_8_ = lVar8;
              auVar13._12_4_ = 0x45300000;
              dVar15 = auVar13._8_8_ - 1.9342813113834067e+25;
              dVar14 = (dVar15 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) *
                       local_80;
            } while( true );
          }
          pcVar7 = "Invalid step penalty";
        }
        else {
          pcVar7 = "Invalid source sequence index";
        }
        std::operator<<((ostream *)&std::cerr,pcVar7);
        return 1;
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"Cannot open file `");
      poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
    }
    pcVar7 = "\'.";
  }
  poVar6 = std::operator<<(poVar6,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar6);
  return 1;
}

Assistant:

int main (int argc, const char * argv[])
{
    if (argc < 9)
    {
        cerr << "Usage is `" << Usage << "'." << endl;
        exit(1);
    }

    const    char *S = argv[1];

    long     firstSequenceLength = 0,
             min_overlap = 1;


    /*if (distanceThreshold > 0.)
    	min_overlap = 1./distanceThreshold;*/

    min_overlap = atoi (argv[4]);
    if (min_overlap < 1) {
        cerr << "Minimum overlap must be a positive integer" << endl;
        return 1;
    }


    FILE *F  = strcmp (S,"-") == 0 ? stdin: fopen(S, "r"),
          *FO = strcmp (argv[2],"-") == 0? stdout: fopen (argv[2], "w");

    if (F == NULL) {
        cerr << "Cannot open file `" << S << "'." << endl;
        return 1;
    }

    if (FO == NULL) {
        cerr << "Cannot open file `" << FO << "'." << endl;
        return 1;
    }

    char resolutionOption = RESOLVE;

    if (strcmp (argv[3], "GAPMM") == 0) {
        resolutionOption = GAPMM;
    } else if (strcmp (argv[3], "AVERAGE") == 0) {
        resolutionOption = AVERAGE;
    } else if (strcmp (argv[3], "SKIP") == 0) {
        resolutionOption = SKIP;
    }




    char automatonState = 0;
    // 0 - between sequences
    // 1 - reading sequence name
    // 2 - reading sequence

    nameLengths.appendValue (0);
    seqLengths.appendValue (0);
    initAlphabets ();

    if (readFASTA (F, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength) == 1)
        return 1;

    fclose(F);

    unsigned long sequenceCount = seqLengths.length()-1;

    cerr << "Read " << sequenceCount << " sequences of length " << firstSequenceLength << endl ;

    unsigned long source = atoi (argv[5]);
    if (source < 0 || source >= sequenceCount) {
        cerr << "Invalid source sequence index";
        return 1;
    } else {
        cerr << "Using " << stringText (names, nameLengths, source) << " as the source" << endl;
    }

    initializeSingleSource (sequenceCount, source);

    double percentDone = 0.0,
           normalizer  = 100./sequenceCount,
           step_penalty = 10.;

    step_penalty = atof (argv[7]);
    if (step_penalty <= 0.0) {
        cerr << "Invalid step penalty";
        return 1;
    } else {
        cerr << "Using step penalty of " << step_penalty << endl;
    }

    while (workingNodes.length()) {
        unsigned long add_this_node = workingNodes.extractMin (distanceEstimates);
        relaxDistanceEstimates (add_this_node,firstSequenceLength,resolutionOption,min_overlap,step_penalty);
        if ((sequenceCount-workingNodes.length()) * normalizer - percentDone > 0.1 || workingNodes.length () == 0) {
            cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b" << setw(8) << percentDone << "% done ";
            percentDone = (sequenceCount-workingNodes.length()) * normalizer;
        }
    }
    cerr << endl;

    bool is_json = strcmp (argv[6],"JSON") == 0;

    if (is_json) {
        fprintf (FO, "\n{\n");
    }

    for (long which_arg = 8; which_arg < argc; which_arg ++) {
        reportPathToSource (atoi (argv[which_arg]),FO, is_json, firstSequenceLength,resolutionOption,min_overlap,step_penalty);
        if (is_json && which_arg < argc - 1) {
            fprintf (FO, ",\n");
        }
    }

    if (is_json) {
        fprintf (FO, "\n}\n");
    }

    if (FO != stdout)
        fclose (FO);
    return 0;

}